

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O0

string * cfd::api::json::ElementsDecodeIssuance::GetAssetamountcommitmentString_abi_cxx11_
                   (ElementsDecodeIssuance *obj)

{
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000088;
  
  core::ConvertToString<std::__cxx11::string>(in_stack_00000088);
  return in_RDI;
}

Assistant:

static std::string GetAssetamountcommitmentString(  // line separate
      const ElementsDecodeIssuance& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.assetamountcommitment_);
  }